

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O1

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,DisableIffAssertionExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  NonProceduralExprVisitor visitor;
  bitmask<slang::analysis::VisitFlags> local_44;
  Clock local_40;
  AnalysisContext *local_38;
  Symbol *local_30;
  
  local_38 = this->context;
  local_30 = this->parentSymbol;
  local_44.m_bits = flags.m_bits;
  local_40 = outerClock;
  ast::Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::NonProceduralExprVisitor&>
            (expr->condition,expr->condition,(AlwaysFFVisitor *)&local_38);
  ast::AssertionExpr::
  visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
            (__return_storage_ptr__,expr->expr,this,&local_40,&local_44);
  return __return_storage_ptr__;
}

Assistant:

VisitResult visit(const DisableIffAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        // Our current clock doesn't flow into the disable iff condition,
        // so check it separately for explicit clocking of sequence instances
        // and calls to sampled value functions.
        NonProceduralExprVisitor visitor(context, parentSymbol);
        expr.condition.visit(visitor);

        return expr.expr.visit(*this, outerClock, flags);
    }